

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

HRESULT __thiscall
ChakraCoreHostScriptContext::FetchImportedModule
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *referencingModule,LPCOLESTR specifier
          ,ModuleRecordBase **dependentModuleRecord)

{
  JsErrorCode JVar1;
  ScriptContext *scriptContext;
  JavascriptString *pJVar2;
  AutoFilterExceptionRegion local_44;
  JsErrorCode errorCode;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  JsModuleRecord dependentRecord;
  JavascriptString *specifierVar;
  ModuleRecordBase **dependentModuleRecord_local;
  LPCOLESTR specifier_local;
  ModuleRecordBase *referencingModule_local;
  ChakraCoreHostScriptContext *this_local;
  
  if (this->fetchImportedModuleCallback == (FetchImportedModuleCallBack)0x0) {
    this_local._4_4_ = -0x7ff8ffa9;
  }
  else {
    scriptContext = HostScriptContext::GetScriptContext(&this->super_HostScriptContext);
    pJVar2 = Js::JavascriptString::NewCopySz(specifier,scriptContext);
    _errorCode = (ModuleRecordBase *)0x0;
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_44,ExceptionType_All);
    JVar1 = (*this->fetchImportedModuleCallback)
                      (referencingModule,pJVar2,(JsModuleRecord *)&errorCode);
    if (JVar1 == JsNoError) {
      *dependentModuleRecord = _errorCode;
      this_local._4_4_ = 0;
    }
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_44);
    if (JVar1 != JsNoError) {
      this_local._4_4_ = -0x7ff8ffa9;
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::FetchImportedModule(Js::ModuleRecordBase* referencingModule, LPCOLESTR specifier, Js::ModuleRecordBase** dependentModuleRecord)
{
    if (fetchImportedModuleCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    Js::JavascriptString* specifierVar = Js::JavascriptString::NewCopySz(specifier, GetScriptContext());
    JsModuleRecord dependentRecord = JS_INVALID_REFERENCE;
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = fetchImportedModuleCallback(referencingModule, specifierVar, &dependentRecord);
        if (errorCode == JsNoError)
        {
            *dependentModuleRecord = static_cast<Js::ModuleRecordBase*>(dependentRecord);
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}